

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_deinit(MppSThdImpl *thd)

{
  MppSThdImpl *thd_local;
  
  if (((MppSThdImpl *)(thd->ctx).thd != thd) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"thd->ctx.thd == thd",
                 "mpp_sthd_deinit",0xdd), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((1 < (int)thd->status) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "thd->status < MPP_STHD_RUNNING","mpp_sthd_deinit",0xde),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pthread_mutex_lock((pthread_mutex_t *)&thd->lock);
  thd->status = MPP_STHD_UNINITED;
  (thd->ctx).thd = (MppSThd)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&thd->lock);
  pthread_cond_destroy((pthread_cond_t *)&thd->cond);
  pthread_mutex_destroy((pthread_mutex_t *)&thd->lock);
  return;
}

Assistant:

static void mpp_sthd_deinit(MppSThdImpl *thd)
{
    mpp_assert(thd->ctx.thd == thd);
    mpp_assert(thd->status < MPP_STHD_RUNNING);

    pthread_mutex_lock(&thd->lock);
    thd->status = MPP_STHD_UNINITED;
    thd->ctx.thd = NULL;
    pthread_mutex_unlock(&thd->lock);

    pthread_cond_destroy(&thd->cond);
    pthread_mutex_destroy(&thd->lock);
}